

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix-test.cc
# Opt level: O0

void __thiscall
SuffixTest_MutSuffix_Test::~SuffixTest_MutSuffix_Test(SuffixTest_MutSuffix_Test *this)

{
  void *in_RDI;
  
  ~SuffixTest_MutSuffix_Test((SuffixTest_MutSuffix_Test *)0x120f98);
  operator_delete(in_RDI,0x48);
  return;
}

Assistant:

TEST_F(SuffixTest, MutSuffix) {
  MutSuffix s;
  EXPECT_TRUE(s == 0);
  s = suffixes_.Add<int>("test", 11, 222);
  EXPECT_STREQ("test", s.name());
  EXPECT_EQ(11, s.kind());
  EXPECT_EQ(222, s.num_values());
  Suffix csuf = s;
  csuf = s;
}